

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

void __thiscall Assembler::processIfOneOpReg(Assembler *this,string *line,int reg)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  *pmVar1;
  int iVar2;
  mapped_type *pmVar3;
  byte *pbVar4;
  char cVar5;
  Assembler *pAVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  byte local_71;
  undefined1 local_70 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  iVar2 = std::__cxx11::string::compare((char *)line);
  cVar5 = (char)reg;
  if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)line), iVar2 == 0)) {
    pmVar1 = &this->codeBySection;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
    local_71 = (byte)locationCounter;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar3,(char *)&local_71);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
    pbVar4 = (byte *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->instrDescription,line);
    local_71 = *pbVar4;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar3,(char *)&local_71);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
    local_71 = cVar5 << 4 | 0xf;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar3,(char *)&local_71);
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)line);
  if (iVar2 == 0) {
    pmVar1 = &this->codeBySection;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
    local_71 = (byte)locationCounter;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar3,(char *)&local_71);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
    pbVar4 = (byte *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->instrDescription,line);
    local_71 = *pbVar4;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar3,(char *)&local_71);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
    local_71 = cVar5 << 4 | 6;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar3,(char *)&local_71);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
    pAVar6 = (Assembler *)(local_70 + 0x20);
    local_70._32_8_ = &local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)pAVar6,"0x42","");
    iVar2 = literalToDecimal(pAVar6,(string *)(local_70 + 0x20));
    local_71 = (byte)iVar2;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar3,(char *)&local_71);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_70._32_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._32_8_ == &local_40) {
      return;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)line);
    if (iVar2 != 0) {
      return;
    }
    pmVar1 = &this->codeBySection;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
    local_71 = (byte)locationCounter;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar3,(char *)&local_71);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
    pbVar4 = (byte *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->instrDescription,line);
    local_71 = *pbVar4;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar3,(char *)&local_71);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
    local_71 = cVar5 << 4 | 6;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar3,(char *)&local_71);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
    pAVar6 = (Assembler *)local_70;
    local_70._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_70 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)pAVar6,"0x12","");
    iVar2 = literalToDecimal(pAVar6,(string *)local_70);
    local_71 = (byte)iVar2;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar3,(char *)&local_71);
    local_40._M_allocated_capacity = local_70._16_8_;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_70._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_70 + 0x10)) {
      return;
    }
  }
  operator_delete(paVar7,local_40._M_allocated_capacity + 1);
  return;
}

Assistant:

void Assembler::processIfOneOpReg(string line, int reg) {
    if (line == "int") {
        codeBySection[currentSectionName].push_back(locationCounter);
        codeBySection[currentSectionName].push_back(instrDescription[line]);
        codeBySection[currentSectionName].push_back((reg << 4) + 15);

    } else if (line == "not") {
        codeBySection[currentSectionName].push_back(locationCounter);
        codeBySection[currentSectionName].push_back(instrDescription[line]);
        codeBySection[currentSectionName].push_back((reg << 4) + 15);

    } else if (line == "pop") {
        codeBySection[currentSectionName].push_back(locationCounter);
        codeBySection[currentSectionName].push_back(instrDescription[line]);
        codeBySection[currentSectionName].push_back((reg << 4) + 6);
        codeBySection[currentSectionName].push_back(literalToDecimal("0x42"));

    } else if (line == "push") {
        codeBySection[currentSectionName].push_back(locationCounter);
        codeBySection[currentSectionName].push_back(instrDescription[line]);
        codeBySection[currentSectionName].push_back((reg << 4) + 6);
        codeBySection[currentSectionName].push_back(literalToDecimal("0x12"));

    }

    return;

}